

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_sfp.c
# Opt level: O1

int csp_sfp_recv_fp(csp_conn_t *conn,void **return_data,int *return_datasize,uint32_t timeout,
                   csp_packet_t *first_packet)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  void *__ptr;
  uint8_t *puVar5;
  uint uVar6;
  ulong __size;
  int iVar7;
  uint uVar8;
  uint8_t *puVar9;
  
  *return_data = (void *)0x0;
  *return_datasize = 0;
  if ((first_packet == (csp_packet_t *)0x0) &&
     (first_packet = csp_read(conn,timeout), first_packet == (csp_packet_t *)0x0)) {
    iVar7 = -3;
  }
  else {
    iVar7 = -3;
    __ptr = (void *)0x0;
    __size = 0;
    uVar8 = 0;
    do {
      if (((first_packet->id).flags & 0x10) == 0) {
LAB_00109de6:
        puVar9 = (uint8_t *)0x0;
      }
      else {
        uVar4 = (ulong)first_packet->length;
        if (uVar4 < 8) goto LAB_00109de6;
        puVar5 = first_packet->header + uVar4;
        first_packet->length = first_packet->length - 8;
        uVar2 = *(uint *)puVar5;
        uVar6 = *(uint *)(first_packet->header + uVar4 + 4);
        uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        *(uint *)puVar5 = uVar2;
        uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        *(uint *)(first_packet->header + uVar4 + 4) = uVar6;
        puVar9 = (uint8_t *)0x0;
        if (uVar2 <= uVar6) {
          puVar9 = puVar5;
        }
      }
      if ((puVar9 == (uint8_t *)0x0) || (*(uint *)puVar9 != uVar8)) {
LAB_00109e8a:
        csp_buffer_free(first_packet);
        iVar7 = -0x67;
        iVar3 = 4;
      }
      else if (__ptr == (void *)0x0) {
        __size = (ulong)*(uint *)(puVar9 + 4);
        __ptr = malloc(__size);
        if (__ptr != (void *)0x0) goto LAB_00109e3d;
        csp_buffer_free(first_packet);
        iVar7 = -1;
        iVar3 = 4;
        __ptr = (void *)0x0;
      }
      else {
LAB_00109e3d:
        uVar2 = (uint)__size;
        if ((uVar2 < first_packet->length + uVar8) || (uVar2 != *(uint *)(puVar9 + 4)))
        goto LAB_00109e8a;
        memcpy((void *)((ulong)uVar8 + (long)__ptr),&first_packet->field_12,
               (ulong)first_packet->length);
        uVar1 = first_packet->length;
        uVar8 = uVar8 + uVar1;
        if (uVar8 < uVar2) {
          csp_buffer_free(first_packet);
          if (uVar1 == 0) {
            iVar7 = -0x67;
          }
          iVar3 = (uint)(uVar1 == 0) << 2;
        }
        else {
          csp_buffer_free(first_packet);
          *return_data = __ptr;
          *return_datasize = uVar2;
          iVar3 = 1;
        }
      }
      if (iVar3 != 0) {
        if (iVar3 != 4) {
          return 0;
        }
        break;
      }
      first_packet = csp_read(conn,timeout);
    } while (first_packet != (csp_packet_t *)0x0);
    free(__ptr);
  }
  return iVar7;
}

Assistant:

int csp_sfp_recv_fp(csp_conn_t * conn, void ** return_data, int * return_datasize, uint32_t timeout, csp_packet_t * first_packet) {

	*return_data = NULL; /* Allow caller to assume csp_free() can always be called when dataout is non-NULL */
	*return_datasize = 0;

	/* Get first packet from user, or from connection */
	csp_packet_t * packet;
	if (first_packet == NULL) {
		packet = csp_read(conn, timeout);
		if (packet == NULL) {
			return CSP_ERR_TIMEDOUT;
		}
	} else {
		packet = first_packet;
	}

	uint8_t * data = NULL;
	uint32_t datasize = 0;
	uint32_t data_offset = 0;
	int error = CSP_ERR_TIMEDOUT;
	do {
		/* Read SFP header */
		sfp_header_t * sfp_header = csp_sfp_header_remove(packet);
		if (sfp_header == NULL) {
			//csp_print("%s: %u:%u, invalid message, id.flags: 0x%x, length: %u\n", __func__, packet->id.src, packet->id.sport, packet->id.flags, packet->length);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		//csp_print("%s: %u:%u, fragment %" PRIu32 "/%" PRIu32 "\n",  __func__, packet->id.src, packet->id.sport, sfp_header->offset + packet->length, sfp_header->totalsize);

		/* Consistency check */
		if (sfp_header->offset != data_offset) {
			//csp_print("%s: %u:%u, invalid message, offset %" PRIu32 " (expected %" PRIu32 "), length: %u, totalsize %" PRIu32 "\n", __func__, packet->id.src, packet->id.sport, sfp_header->offset, data_offset, packet->length, sfp_header->totalsize);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		/* Allocate memory */
		if (data == NULL) {
			datasize = sfp_header->totalsize;
			data = malloc(datasize);
			if (data == NULL) {
				//csp_print("%s: %u:%u, malloc(%" PRIu32 ") failed\n", __func__, packet->id.src, packet->id.sport, datasize);
				csp_buffer_free(packet);

				error = CSP_ERR_NOMEM;
				goto error;
			}
		}

		/* Consistency check */
		if (((data_offset + packet->length) > datasize) || (datasize != sfp_header->totalsize)) {
			//csp_print("%s: %u:%u, invalid size, sfp.offset: %" PRIu32 ", length: %u, total: %" PRIu32 " / %" PRIu32 "\n", __func__, packet->id.src, packet->id.sport, sfp_header->offset, packet->length, datasize, sfp_header->totalsize);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		/* Copy data to output */
		memcpy(data + data_offset, packet->data, packet->length);
		data_offset += packet->length;

		if (data_offset >= datasize) {
			// transfer complete
			csp_buffer_free(packet);

			*return_data = data;  // must be freed by csp_free()
			*return_datasize = datasize;
			return CSP_ERR_NONE;
		}

		/* Consistency check */
		if (packet->length == 0) {
			//csp_print("%s: %u:%u, invalid size, sfp.offset: %" PRIu32 ", length: %u, total: %" PRIu32 " / %" PRIu32 "\n", __func__, packet->id.src, packet->id.sport, sfp_header->offset, packet->length, datasize, sfp_header->totalsize);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		csp_buffer_free(packet);

	} while ((packet = csp_read(conn, timeout)) != NULL);

error:
	free(data);
	return error;
}